

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer.cpp
# Opt level: O2

void __thiscall dynamicgraph::Tracer::Tracer(Tracer *this,string *n)

{
  SignalTimeDependent<int,_int> *this_00;
  allocator<char> local_162;
  allocator<char> local_161;
  string local_160;
  string local_140;
  allocator<char> local_11a;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  string doc;
  string local_90;
  undefined1 local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  dynamicgraph::Entity::Entity(&this->super_Entity,(string *)n);
  *(undefined ***)this = &PTR__Tracer_0011e1c8;
  (this->toTraceSignals).
  super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->toTraceSignals;
  (this->toTraceSignals).
  super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->toTraceSignals;
  (this->toTraceSignals).
  super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->files_mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->files_mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->files_mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->files_mtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->files_mtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->traceStyle = EACH_TIME;
  this->frequency = 1.0;
  (this->basename)._M_dataplus._M_p = (pointer)&(this->basename).field_2;
  (this->basename)._M_string_length = 0;
  (this->basename).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->suffix,".dat",(allocator<char> *)&doc);
  (this->rootdir)._M_dataplus._M_p = (pointer)&(this->rootdir).field_2;
  (this->rootdir)._M_string_length = 0;
  (this->rootdir).field_2._M_local_buf[0] = '\0';
  this->namesSet = false;
  (this->files).
  super__List_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->files;
  (this->files).
  super__List_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->files;
  (this->files).
  super__List_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->names).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->names;
  (this->names).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->names;
  (this->names).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->play = false;
  this->timeStart = 0;
  local_70._8_8_ = recordTrigger;
  local_70._16_8_ = 0;
  local_70._0_8_ =
       boost::function2<int&,int&,int>::
       assign_to<boost::_bi::bind_t<int&,boost::_mfi::mf2<int&,dynamicgraph::Tracer,int&,int_const&>,boost::_bi::list3<boost::_bi::value<dynamicgraph::Tracer*>,boost::arg<1>,boost::arg<2>>>>(boost::_bi::bind_t<int&,boost::_mfi::mf2<int&,dynamicgraph::Tracer,int&,int_const&>,boost::_bi::list3<boost::_bi::value<dynamicgraph::Tracer*>,boost::arg<int>,boost::arg<int>>>)
       ::stored_vtable + 1;
  local_70._24_8_ = this;
  std::operator+(&doc,"Tracer(",n);
  std::operator+(&local_50,&doc,")::triger");
  this_00 = &this->triger;
  SignalTimeDependent<int,_int>::SignalTimeDependent
            (this_00,(function2<int_&,_int_&,_int> *)local_70,(SignalArray_const<int> *)&sotNOSIGNAL
             ,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&doc);
  boost::function2<int_&,_int_&,_int>::~function2((function2<int_&,_int_&,_int> *)local_70);
  SignalArray<int>::SignalArray
            ((SignalArray<int> *)&doc,
             (SignalBase<int> *)
             ((long)&(this_00->super_TimeDependency<int>)._vptr_TimeDependency +
             (long)(this_00->super_TimeDependency<int>)._vptr_TimeDependency[-3]));
  dynamicgraph::Entity::signalRegistration((SignalArray *)this);
  SignalArray<int>::~SignalArray((SignalArray<int> *)&doc);
  doc._M_dataplus._M_p = (pointer)&doc.field_2;
  doc._M_string_length = 0;
  doc.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"Add a new signal to trace.",(allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"string (signal name)",&local_161);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"string (filename, empty for default",&local_162);
  command::docCommandVoid2(&local_160,&local_140,&local_118,&local_f8);
  std::__cxx11::string::operator=((string *)&doc,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"add",(allocator<char> *)&local_140);
  command::makeCommandVoid2<dynamicgraph::Tracer,std::__cxx11::string,std::__cxx11::string>
            ((command *)this,(Tracer *)addSignalToTraceByName,0,&doc);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"Remove all signals. If necessary, close open files.",
             (allocator<char> *)&local_118);
  command::docCommandVoid0(&local_160,&local_140);
  std::__cxx11::string::operator=((string *)&doc,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"clear",(allocator<char> *)&local_140);
  command::makeCommandVoid0<dynamicgraph::Tracer>
            ((command *)this,(Tracer *)clearSignalToTrace,0,&doc);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,
             "Gives the args for file opening, and if signals have been set, open the corresponding files."
             ,&local_161);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"string (dirname)",&local_162);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"string (prefix)",&local_119);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"string (suffix)",&local_11a);
  command::docCommandVoid3(&local_160,&local_140,&local_118,&local_f8,&local_90);
  std::__cxx11::string::operator=((string *)&doc,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"open",(allocator<char> *)&local_140);
  command::
  makeCommandVoid3<dynamicgraph::Tracer,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            ((command *)this,(Tracer *)openFiles,0,&doc);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"Close all the open files.",(allocator<char> *)&local_118);
  command::docCommandVoid0(&local_160,&local_140);
  std::__cxx11::string::operator=((string *)&doc,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"close",(allocator<char> *)&local_140);
  command::makeCommandVoid0<dynamicgraph::Tracer>((command *)this,(Tracer *)0x49,0,&doc);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,
             "If necessary, dump (can be done automatically for some traces type).",
             (allocator<char> *)&local_118);
  command::docCommandVoid0(&local_160,&local_140);
  std::__cxx11::string::operator=((string *)&doc,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"dump",(allocator<char> *)&local_140);
  command::makeCommandVoid0<dynamicgraph::Tracer>((command *)this,(Tracer *)0x61,0,&doc);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"Start the tracing process.",(allocator<char> *)&local_118);
  command::docCommandVoid0(&local_160,&local_140);
  std::__cxx11::string::operator=((string *)&doc,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"start",(allocator<char> *)&local_140);
  command::makeCommandVoid0<dynamicgraph::Tracer>((command *)this,(Tracer *)start,0,&doc);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"Stop temporarily the tracing process.",
             (allocator<char> *)&local_118);
  command::docCommandVoid0(&local_160,&local_140);
  std::__cxx11::string::operator=((string *)&doc,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"stop",(allocator<char> *)&local_140);
  command::makeCommandVoid0<dynamicgraph::Tracer>((command *)this,(Tracer *)stop,0,&doc);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"getTimeStart",(allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"timeStart",&local_161);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"int",&local_162);
  command::docDirectGetter(&local_140,&local_118,&local_f8);
  command::makeDirectGetter<dynamicgraph::Tracer,int>(this,&this->timeStart,&local_140);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"setTimeStart",(allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"timeStart",&local_161);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"int",&local_162);
  command::docDirectSetter(&local_140,&local_118,&local_f8);
  command::makeDirectSetter<dynamicgraph::Tracer,int>(this,&this->timeStart,&local_140);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&doc);
  return;
}

Assistant:

Tracer::Tracer(const std::string n)
    : Entity(n),
      toTraceSignals(),
      traceStyle(TRACE_STYLE_DEFAULT),
      frequency(1),
      basename(),
      suffix(".dat"),
      rootdir(),
      namesSet(false),
      files(),
      names(),
      play(false),
      timeStart(0),
      triger(boost::bind(&Tracer::recordTrigger, this, _1, _2), sotNOSIGNAL,
             "Tracer(" + n + ")::triger") {
  signalRegistration(triger);

  /* --- Commands --- */
  {
    using namespace dynamicgraph::command;
    std::string doc;

    doc = docCommandVoid2("Add a new signal to trace.", "string (signal name)",
                          "string (filename, empty for default");
    addCommand("add",
               makeCommandVoid2(*this, &Tracer::addSignalToTraceByName, doc));

    doc =
        docCommandVoid0("Remove all signals. If necessary, close open files.");
    addCommand("clear",
               makeCommandVoid0(*this, &Tracer::clearSignalToTrace, doc));

    doc = docCommandVoid3(
        "Gives the args for file opening, and "
        "if signals have been set, open the corresponding files.",
        "string (dirname)", "string (prefix)", "string (suffix)");
    addCommand("open", makeCommandVoid3(*this, &Tracer::openFiles, doc));

    doc = docCommandVoid0("Close all the open files.");
    addCommand("close", makeCommandVoid0(*this, &Tracer::closeFiles, doc));

    doc = docCommandVoid0(
        "If necessary, dump "
        "(can be done automatically for some traces type).");
    addCommand("dump", makeCommandVoid0(*this, &Tracer::trace, doc));

    doc = docCommandVoid0("Start the tracing process.");
    addCommand("start", makeCommandVoid0(*this, &Tracer::start, doc));

    doc = docCommandVoid0("Stop temporarily the tracing process.");
    addCommand("stop", makeCommandVoid0(*this, &Tracer::stop, doc));

    addCommand("getTimeStart",
               makeDirectGetter(*this, &timeStart,
                                docDirectGetter("timeStart", "int")));
    addCommand("setTimeStart",
               makeDirectSetter(*this, &timeStart,
                                docDirectSetter("timeStart", "int")));
  }  // using namespace command
}